

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointMotor.cpp
# Opt level: O1

void __thiscall
btMultiBodyJointMotor::createConstraintRows
          (btMultiBodyJointMotor *this,btMultiBodyConstraintArray *constraintRows,
          btMultiBodyJacobianData *data,btContactSolverInfo *infoGlobal)

{
  btMultiBodySolverConstraint *solverConstraint;
  btScalar upperLimit;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  eFeatherstoneJointType eVar5;
  float *pfVar6;
  btMultibodyLink *pbVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  void *pvVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  btQuaternion q;
  btVector3 local_48;
  
  if ((this->super_btMultiBodyConstraint).m_numDofsFinalized !=
      (this->super_btMultiBodyConstraint).m_jacSizeBoth) {
    (*(this->super_btMultiBodyConstraint)._vptr_btMultiBodyConstraint[2])(this);
  }
  if ((this->super_btMultiBodyConstraint).m_numDofsFinalized ==
      (this->super_btMultiBodyConstraint).m_jacSizeBoth) {
    local_48.m_floats[0] = 0.0;
    local_48.m_floats[1] = 0.0;
    local_48.m_floats[2] = 0.0;
    local_48.m_floats[3] = 0.0;
    if (0 < (this->super_btMultiBodyConstraint).m_numRows) {
      iVar13 = 0;
      do {
        iVar3 = *(int *)(constraintRows + 4);
        if (iVar3 == *(int *)(constraintRows + 8)) {
          iVar15 = iVar3 * 2;
          if (iVar3 == 0) {
            iVar15 = 1;
          }
          if (*(int *)(constraintRows + 8) < iVar15) {
            if (iVar15 == 0) {
              pvVar12 = (void *)0x0;
            }
            else {
              pvVar12 = btAlignedAllocInternal((long)iVar15 * 0xe0,0x10);
            }
            iVar4 = *(int *)(constraintRows + 4);
            if (0 < (long)iVar4) {
              lVar17 = 0;
              do {
                memcpy((void *)(lVar17 + (long)pvVar12),
                       (void *)(*(long *)(constraintRows + 0x10) + lVar17),0xe0);
                lVar17 = lVar17 + 0xe0;
              } while ((long)iVar4 * 0xe0 - lVar17 != 0);
            }
            if (*(void **)(constraintRows + 0x10) != (void *)0x0) {
              if (constraintRows[0x18] == (btMultiBodyConstraintArray)0x1) {
                btAlignedFreeInternal(*(void **)(constraintRows + 0x10));
              }
              *(undefined8 *)(constraintRows + 0x10) = 0;
            }
            constraintRows[0x18] = (btMultiBodyConstraintArray)0x1;
            *(void **)(constraintRows + 0x10) = pvVar12;
            *(int *)(constraintRows + 8) = iVar15;
          }
        }
        *(int *)(constraintRows + 4) = *(int *)(constraintRows + 4) + 1;
        lVar17 = *(long *)(constraintRows + 0x10);
        lVar16 = (long)iVar3 * 0xe0;
        solverConstraint = (btMultiBodySolverConstraint *)(lVar16 + lVar17);
        lVar14 = (long)(this->super_btMultiBodyConstraint).m_jacSizeBoth * (long)iVar13 +
                 (long)(this->super_btMultiBodyConstraint).m_numRows;
        pfVar6 = (this->super_btMultiBodyConstraint).m_data.m_data;
        upperLimit = (this->super_btMultiBodyConstraint).m_maxAppliedImpulse;
        btMultiBodyConstraint::fillMultiBodyConstraint
                  (&this->super_btMultiBodyConstraint,solverConstraint,data,pfVar6 + lVar14,
                   pfVar6 + (long)(int)lVar14 + (long)(this->super_btMultiBodyConstraint).m_jacSizeA
                   ,&local_48,&local_48,&local_48,0.0,infoGlobal,-upperLimit,upperLimit,1.0,false,
                   this->m_desiredVelocity,0.0);
        *(btMultiBodyJointMotor **)(lVar17 + 0xd0 + lVar16) = this;
        *(int *)(lVar17 + 0xd8 + lVar16) = iVar13;
        iVar3 = (this->super_btMultiBodyConstraint).m_linkA;
        pbVar7 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
        eVar5 = pbVar7[iVar3].m_jointType;
        if (eVar5 == ePrismatic) {
          btMatrix3x3::getRotation(&pbVar7[iVar3].m_cachedWorldTransform.m_basis,&q);
          fVar19 = q.super_btQuadWord.m_floats[2];
          fVar21 = q.super_btQuadWord.m_floats[3];
          iVar3 = (this->super_btMultiBodyConstraint).m_linkA;
          pbVar7 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
          fVar18 = pbVar7[iVar3].m_axes[0].m_bottomVec.m_floats[2];
          uVar1 = *(undefined8 *)pbVar7[iVar3].m_axes[0].m_bottomVec.m_floats;
          uVar2 = *(undefined8 *)(pbVar7[iVar3].m_axes[0].m_bottomVec.m_floats + 1);
          fVar22 = (float)uVar1;
          fVar27 = (float)((ulong)uVar1 >> 0x20);
          fVar25 = q.super_btQuadWord.m_floats[0];
          fVar20 = (fVar21 * fVar27 + fVar19 * fVar22) - fVar25 * fVar18;
          fVar26 = q.super_btQuadWord.m_floats[1];
          fVar23 = (fVar18 * fVar21 + (float)uVar2 * fVar25) - fVar26 * fVar22;
          fVar24 = (fVar22 * fVar21 + (float)((ulong)uVar2 >> 0x20) * fVar26) - fVar19 * fVar27;
          fVar28 = -fVar26;
          fVar29 = -fVar19;
          fVar22 = fVar18 * fVar29 + (fVar27 * fVar28 - fVar22 * fVar25);
          fVar18 = fVar26 * fVar23 + fVar29 * fVar20 + -fVar25 * fVar22 + fVar24 * fVar21;
          fVar19 = fVar19 * fVar24 + -fVar25 * fVar23 + fVar28 * fVar22 + fVar20 * fVar21;
          fVar21 = fVar20 * fVar25 + fVar24 * fVar28 + fVar22 * fVar29 + fVar23 * fVar21;
          auVar11._4_4_ = fVar19;
          auVar11._0_4_ = fVar18;
          auVar11._8_4_ = fVar21;
          auVar11._12_4_ = 0;
          *(undefined1 (*) [16])(solverConstraint->m_contactNormal1).m_floats = auVar11;
          auVar9._8_4_ = -fVar21;
          auVar9._0_8_ = CONCAT44(fVar19,fVar18) ^ 0x8000000080000000;
          auVar9._12_4_ = 0;
          *(undefined1 (*) [16])(solverConstraint->m_contactNormal2).m_floats = auVar9;
          (solverConstraint->m_relpos1CrossNormal).m_floats[0] = 0.0;
          (solverConstraint->m_relpos1CrossNormal).m_floats[1] = 0.0;
          (solverConstraint->m_relpos1CrossNormal).m_floats[2] = 0.0;
          (solverConstraint->m_relpos1CrossNormal).m_floats[3] = 0.0;
          (solverConstraint->m_relpos2CrossNormal).m_floats[0] = 0.0;
          (solverConstraint->m_relpos2CrossNormal).m_floats[1] = 0.0;
          (solverConstraint->m_relpos2CrossNormal).m_floats[2] = 0.0;
          (solverConstraint->m_relpos2CrossNormal).m_floats[3] = 0.0;
        }
        else if (eVar5 == eRevolute) {
          (solverConstraint->m_contactNormal1).m_floats[0] = 0.0;
          (solverConstraint->m_contactNormal1).m_floats[1] = 0.0;
          (solverConstraint->m_contactNormal1).m_floats[2] = 0.0;
          (solverConstraint->m_contactNormal1).m_floats[3] = 0.0;
          (solverConstraint->m_contactNormal2).m_floats[0] = 0.0;
          (solverConstraint->m_contactNormal2).m_floats[1] = 0.0;
          (solverConstraint->m_contactNormal2).m_floats[2] = 0.0;
          (solverConstraint->m_contactNormal2).m_floats[3] = 0.0;
          btMatrix3x3::getRotation
                    (&(((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data
                      [(this->super_btMultiBodyConstraint).m_linkA].m_cachedWorldTransform.m_basis,
                     &q);
          fVar19 = q.super_btQuadWord.m_floats[2];
          fVar21 = q.super_btQuadWord.m_floats[3];
          iVar3 = (this->super_btMultiBodyConstraint).m_linkA;
          pbVar7 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
          fVar18 = pbVar7[iVar3].m_axes[0].m_topVec.m_floats[2];
          uVar1 = *(undefined8 *)pbVar7[iVar3].m_axes[0].m_topVec.m_floats;
          uVar2 = *(undefined8 *)(pbVar7[iVar3].m_axes[0].m_topVec.m_floats + 1);
          fVar22 = (float)uVar1;
          fVar27 = (float)((ulong)uVar1 >> 0x20);
          fVar25 = q.super_btQuadWord.m_floats[0];
          fVar20 = (fVar21 * fVar27 + fVar19 * fVar22) - fVar25 * fVar18;
          fVar26 = q.super_btQuadWord.m_floats[1];
          fVar23 = (fVar18 * fVar21 + (float)uVar2 * fVar25) - fVar26 * fVar22;
          fVar24 = (fVar22 * fVar21 + (float)((ulong)uVar2 >> 0x20) * fVar26) - fVar19 * fVar27;
          fVar28 = -fVar26;
          fVar29 = -fVar19;
          fVar22 = fVar18 * fVar29 + (fVar27 * fVar28 - fVar22 * fVar25);
          fVar18 = fVar26 * fVar23 + fVar29 * fVar20 + -fVar25 * fVar22 + fVar24 * fVar21;
          fVar19 = fVar19 * fVar24 + -fVar25 * fVar23 + fVar28 * fVar22 + fVar20 * fVar21;
          fVar21 = fVar20 * fVar25 + fVar24 * fVar28 + fVar22 * fVar29 + fVar23 * fVar21;
          auVar10._4_4_ = fVar19;
          auVar10._0_4_ = fVar18;
          auVar10._8_4_ = fVar21;
          auVar10._12_4_ = 0;
          *(undefined1 (*) [16])(solverConstraint->m_relpos1CrossNormal).m_floats = auVar10;
          auVar8._8_4_ = -fVar21;
          auVar8._0_8_ = CONCAT44(fVar19,fVar18) ^ 0x8000000080000000;
          auVar8._12_4_ = 0;
          *(undefined1 (*) [16])(solverConstraint->m_relpos2CrossNormal).m_floats = auVar8;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 < (this->super_btMultiBodyConstraint).m_numRows);
    }
  }
  return;
}

Assistant:

void btMultiBodyJointMotor::createConstraintRows(btMultiBodyConstraintArray& constraintRows,
		btMultiBodyJacobianData& data,
		const btContactSolverInfo& infoGlobal)
{
    // only positions need to be updated -- data.m_jacobians and force
    // directions were set in the ctor and never change.
	
	if (m_numDofsFinalized != m_jacSizeBoth)
	{
        finalizeMultiDof();
	}

	//don't crash
	if (m_numDofsFinalized != m_jacSizeBoth)
		return;

	const btScalar posError = 0;
	const btVector3 dummy(0, 0, 0);

	for (int row=0;row<getNumRows();row++)
	{
		btMultiBodySolverConstraint& constraintRow = constraintRows.expandNonInitializing();


		fillMultiBodyConstraint(constraintRow,data,jacobianA(row),jacobianB(row),dummy,dummy,dummy,posError,infoGlobal,-m_maxAppliedImpulse,m_maxAppliedImpulse,1,false,m_desiredVelocity);
		constraintRow.m_orgConstraint = this;
		constraintRow.m_orgDofIndex = row;
		{
			//expect either prismatic or revolute joint type for now
			btAssert((m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::eRevolute)||(m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::ePrismatic));
			switch (m_bodyA->getLink(m_linkA).m_jointType)
			{
				case btMultibodyLink::eRevolute:
				{
					constraintRow.m_contactNormal1.setZero();
					constraintRow.m_contactNormal2.setZero();
					btVector3 revoluteAxisInWorld = quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_topVec);
					constraintRow.m_relpos1CrossNormal=revoluteAxisInWorld;
					constraintRow.m_relpos2CrossNormal=-revoluteAxisInWorld;
					
					break;
				}
				case btMultibodyLink::ePrismatic:
				{
					btVector3 prismaticAxisInWorld = quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_bottomVec);
					constraintRow.m_contactNormal1=prismaticAxisInWorld;
					constraintRow.m_contactNormal2=-prismaticAxisInWorld;
					constraintRow.m_relpos1CrossNormal.setZero();
					constraintRow.m_relpos2CrossNormal.setZero();
					
					break;
				}
				default:
				{
					btAssert(0);
				}
			};
			
		}

	}

}